

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O0

SECURE_DEVICE_TYPE get_secure_device_type(IOTHUB_SECURITY_TYPE sec_type)

{
  undefined4 local_10;
  SECURE_DEVICE_TYPE ret;
  IOTHUB_SECURITY_TYPE sec_type_local;
  
  if (sec_type == IOTHUB_SECURITY_TYPE_SAS) {
    local_10 = SECURE_DEVICE_TYPE_TPM;
  }
  else if (sec_type == IOTHUB_SECURITY_TYPE_X509) {
    local_10 = SECURE_DEVICE_TYPE_X509;
  }
  else if (sec_type == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY) {
    local_10 = SECURE_DEVICE_TYPE_SYMMETRIC_KEY;
  }
  else {
    local_10 = SECURE_DEVICE_TYPE_UNKNOWN;
  }
  return local_10;
}

Assistant:

static SECURE_DEVICE_TYPE get_secure_device_type(IOTHUB_SECURITY_TYPE sec_type)
{
    SECURE_DEVICE_TYPE ret;

    switch (sec_type)
    {
#if defined(HSM_TYPE_SAS_TOKEN)  || defined(HSM_AUTH_TYPE_CUSTOM)
        case IOTHUB_SECURITY_TYPE_SAS:
            ret = SECURE_DEVICE_TYPE_TPM;
            break;
#endif

#if defined(HSM_TYPE_X509) || defined(HSM_TYPE_RIOT) || defined(HSM_AUTH_TYPE_CUSTOM)
        case IOTHUB_SECURITY_TYPE_X509:
            ret = SECURE_DEVICE_TYPE_X509;
            break;
#endif

#if defined(HSM_TYPE_SYMM_KEY) || defined(HSM_AUTH_TYPE_CUSTOM)
        case IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY:
            ret = SECURE_DEVICE_TYPE_SYMMETRIC_KEY;
            break;
#endif

#ifdef HSM_TYPE_HTTP_EDGE
        case IOTHUB_SECURITY_TYPE_HTTP_EDGE:
            ret = SECURE_DEVICE_TYPE_HTTP_EDGE;
            break;
#endif

        default:
            ret = SECURE_DEVICE_TYPE_UNKNOWN;
            break;
    }

    return ret;
}